

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::WriteObjectsVariable
          (cmMakefileTargetGenerator *this,string *variableName,string *variableNameExternal,
          bool useWatcomQuote)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  cmMakefile *this_00;
  cmGeneratedFileStream *pcVar2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  char *pcVar6;
  string local_1d8;
  string local_1b8;
  reference local_198;
  string *obj_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string currentBinDir;
  string local_150;
  string local_130;
  string local_110;
  reference local_f0;
  string *obj;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_c8;
  char *local_a8;
  char *lineContinue;
  string object;
  allocator<char> local_69;
  string local_68;
  string local_48;
  byte local_21;
  string *psStack_20;
  bool useWatcomQuote_local;
  string *variableNameExternal_local;
  string *variableName_local;
  cmMakefileTargetGenerator *this_local;
  
  pcVar1 = this->LocalGenerator;
  local_21 = useWatcomQuote;
  psStack_20 = variableNameExternal;
  variableNameExternal_local = variableName;
  variableName_local = (string *)this;
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"_OBJECTS",&local_69);
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_48,pcVar1,psVar4,&local_68);
  std::__cxx11::string::operator=((string *)variableNameExternal_local,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  poVar5 = std::operator<<((ostream *)this->BuildFileStream,"# Object files for target ");
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar5 = std::operator<<(poVar5,(string *)psVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,(string *)variableNameExternal_local);
  std::operator<<(poVar5," =");
  std::__cxx11::string::string((string *)&lineContinue);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_MAKE_LINE_CONTINUE",(allocator<char> *)((long)&__range1 + 7)
            );
  pcVar6 = cmMakefile::GetDefinition(this_00,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  local_a8 = pcVar6;
  if (pcVar6 == (char *)0x0) {
    local_a8 = "\\";
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Objects);
  obj = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->Objects);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&obj);
    if (!bVar3) break;
    local_f0 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    poVar5 = std::operator<<((ostream *)this->BuildFileStream," ");
    poVar5 = std::operator<<(poVar5,local_a8);
    std::operator<<(poVar5,"\n");
    pcVar2 = this->BuildFileStream;
    cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath
              (&local_110,local_f0,(bool)(local_21 & 1));
    std::operator<<((ostream *)pcVar2,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)this->BuildFileStream,"\n");
  pcVar1 = this->LocalGenerator;
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"_EXTERNAL_OBJECTS",
             (allocator<char> *)(currentBinDir.field_2._M_local_buf + 0xf));
  cmLocalUnixMakefileGenerator3::CreateMakeVariable(&local_130,pcVar1,psVar4,&local_150);
  std::__cxx11::string::operator=((string *)psStack_20,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)(currentBinDir.field_2._M_local_buf + 0xf));
  poVar5 = std::operator<<((ostream *)this->BuildFileStream,"\n");
  poVar5 = std::operator<<(poVar5,"# External object files for target ");
  psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  poVar5 = std::operator<<(poVar5,(string *)psVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,(string *)psStack_20);
  std::operator<<(poVar5," =");
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)this->LocalGenerator);
  std::__cxx11::string::string((string *)&__range1_1,(string *)psVar4);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->ExternalObjects);
  obj_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->ExternalObjects);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&obj_1);
    if (!bVar3) break;
    local_198 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_1);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_1b8,(cmLocalGenerator *)this->LocalGenerator,(string *)&__range1_1,local_198);
    std::__cxx11::string::operator=((string *)&lineContinue,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    poVar5 = std::operator<<((ostream *)this->BuildFileStream," ");
    poVar5 = std::operator<<(poVar5,local_a8);
    std::operator<<(poVar5,"\n");
    pcVar2 = this->BuildFileStream;
    cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath
              (&local_1d8,local_198,(bool)(local_21 & 1));
    std::operator<<((ostream *)pcVar2,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  poVar5 = std::operator<<((ostream *)this->BuildFileStream,"\n");
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&__range1_1);
  std::__cxx11::string::~string((string *)&lineContinue);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteObjectsVariable(
  std::string& variableName, std::string& variableNameExternal,
  bool useWatcomQuote)
{
  // Write a make variable assignment that lists all objects for the
  // target.
  variableName = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_OBJECTS");
  *this->BuildFileStream << "# Object files for target "
                         << this->GeneratorTarget->GetName() << "\n"
                         << variableName << " =";
  std::string object;
  const char* lineContinue =
    this->Makefile->GetDefinition("CMAKE_MAKE_LINE_CONTINUE");
  if (!lineContinue) {
    lineContinue = "\\";
  }
  for (std::string const& obj : this->Objects) {
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n";

  // Write a make variable assignment that lists all external objects
  // for the target.
  variableNameExternal = this->LocalGenerator->CreateMakeVariable(
    this->GeneratorTarget->GetName(), "_EXTERNAL_OBJECTS");
  /* clang-format off */
  *this->BuildFileStream
    << "\n"
    << "# External object files for target "
    << this->GeneratorTarget->GetName() << "\n"
    << variableNameExternal << " =";
  /* clang-format on */
  std::string currentBinDir =
    this->LocalGenerator->GetCurrentBinaryDirectory();
  for (std::string const& obj : this->ExternalObjects) {
    object =
      this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir, obj);
    *this->BuildFileStream << " " << lineContinue << "\n";
    *this->BuildFileStream
      << cmLocalUnixMakefileGenerator3::ConvertToQuotedOutputPath(
           obj, useWatcomQuote);
  }
  *this->BuildFileStream << "\n"
                         << "\n";
}